

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

int32_t icu_63::offsetStrToMillis(UnicodeString *str,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  int32_t millis;
  int32_t iStack_34;
  UChar s;
  int length;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t sign;
  UBool isValid;
  UErrorCode *status_local;
  UnicodeString *str_local;
  
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 != '\0') {
    return 0;
  }
  bVar1 = false;
  min = 0;
  sec = 0;
  length = 0;
  iStack_34 = 0;
  iVar4 = UnicodeString::length(str);
  if ((iVar4 == 5) || (iVar4 == 7)) {
    cVar3 = UnicodeString::charAt(str,0);
    if (cVar3 == L'+') {
      min = 1;
    }
    else {
      if (cVar3 != L'-') goto LAB_00250398;
      min = -1;
    }
    sec = parseAsciiDigits(str,1,2,status);
    length = parseAsciiDigits(str,3,2,status);
    if (iVar4 == 7) {
      iStack_34 = parseAsciiDigits(str,5,2,status);
    }
    UVar2 = ::U_FAILURE(*status);
    if (UVar2 == '\0') {
      bVar1 = true;
    }
  }
LAB_00250398:
  if (bVar1) {
    str_local._4_4_ = min * ((sec * 0x3c + length) * 0x3c + iStack_34) * 1000;
  }
  else {
    *status = U_INVALID_FORMAT_ERROR;
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

static int32_t offsetStrToMillis(const UnicodeString& str, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0;
    }

    UBool isValid = FALSE;
    int32_t sign = 0, hour = 0, min = 0, sec = 0;

    do {
        int length = str.length();
        if (length != 5 && length != 7) {
            // utf-offset must be 5 or 7 characters
            break;
        }
        // sign
        UChar s = str.charAt(0);
        if (s == PLUS) {
            sign = 1;
        } else if (s == MINUS) {
            sign = -1;
        } else {
            // utf-offset must start with "+" or "-"
            break;
        }
        hour = parseAsciiDigits(str, 1, 2, status);
        min = parseAsciiDigits(str, 3, 2, status);
        if (length == 7) {
            sec = parseAsciiDigits(str, 5, 2, status);
        }
        if (U_FAILURE(status)) {
            break;
        }
        isValid = true;
    } while(false);

    if (!isValid) {
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
    int32_t millis = sign * ((hour * 60 + min) * 60 + sec) * 1000;
    return millis;
}